

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void chan_set4op(opl_chip *chip,Bit8u data)

{
  byte local_13;
  byte local_12;
  Bit8u chnum;
  Bit8u bit;
  Bit8u data_local;
  opl_chip *chip_local;
  
  for (local_12 = 0; local_12 < 6; local_12 = local_12 + 1) {
    local_13 = local_12;
    if (2 < local_12) {
      local_13 = local_12 + 6;
    }
    if (((int)(uint)data >> (local_12 & 0x1f) & 1U) == 0) {
      chip->channel[local_13].chtype = '\0';
      chip->channel[(int)(local_13 + 3)].chtype = '\0';
    }
    else {
      chip->channel[local_13].chtype = '\x01';
      chip->channel[(int)(local_13 + 3)].chtype = '\x02';
    }
  }
  return;
}

Assistant:

void chan_set4op(opl_chip *chip, Bit8u data) {
	for (Bit8u bit = 0; bit < 6; bit++) {
		Bit8u chnum = bit;
		if (bit >= 3) {
			chnum += 9 - 3;
		}
		if ((data >> bit) & 0x01) {
			chip->channel[chnum].chtype = ch_4op;
			chip->channel[chnum + 3].chtype = ch_4op2;
		}
		else {
			chip->channel[chnum].chtype = ch_2op;
			chip->channel[chnum + 3].chtype = ch_2op;
		}
	}
}